

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

bool __thiscall AActor::GiveInventory(AActor *this,PClassInventory *type,int amount,bool givecheat)

{
  player_t *ppVar1;
  bool bVar2;
  int iVar3;
  AInventory *this_00;
  PClassInventory *pPVar4;
  bool bVar5;
  AWeapon *local_50;
  DVector3 local_48;
  
  ppVar1 = this->player;
  if (ppVar1 == (player_t *)0x0) {
    local_50 = (AWeapon *)0x0;
    bVar5 = false;
  }
  else {
    local_50 = ppVar1->PendingWeapon;
    bVar5 = ppVar1->ReadyWeapon == (AWeapon *)0x0;
  }
  if (givecheat) {
    local_48.X = (this->__Pos).X;
    local_48.Y = (this->__Pos).Y;
    local_48.Z = (this->__Pos).Z;
    this_00 = (AInventory *)StaticSpawn(&type->super_PClassActor,&local_48,NO_REPLACE,false);
    if (this_00 == (AInventory *)0x0) {
      return false;
    }
    ClearCounters((AActor *)this_00);
    if (amount < 1) goto LAB_0041f533;
  }
  else {
    local_48.X = 0.0;
    local_48.Y = 0.0;
    local_48.Z = 0.0;
    this_00 = (AInventory *)StaticSpawn(&type->super_PClassActor,&local_48,NO_REPLACE,false);
    ClearCounters((AActor *)this_00);
  }
  pPVar4 = type;
  if ((PClassInventory *)ABasicArmorPickup::RegistrationInfo.MyClass != type) {
    do {
      pPVar4 = (PClassInventory *)(pPVar4->super_PClassActor).super_PClass.ParentClass;
      if (pPVar4 == (PClassInventory *)ABasicArmorPickup::RegistrationInfo.MyClass) break;
    } while (pPVar4 != (PClassInventory *)0x0);
    if (pPVar4 == (PClassInventory *)0x0) {
      if ((PClassInventory *)ABasicArmorBonus::RegistrationInfo.MyClass != type) {
        do {
          type = (PClassInventory *)(type->super_PClassActor).super_PClass.ParentClass;
          if (type == (PClassInventory *)ABasicArmorBonus::RegistrationInfo.MyClass) break;
        } while (type != (PClassInventory *)0x0);
        if (type == (PClassInventory *)0x0) {
          if (givecheat) {
            iVar3 = this_00->MaxAmount;
            if (amount < this_00->MaxAmount) {
              iVar3 = amount;
            }
            this_00->Amount = iVar3;
          }
          else {
            this_00->Amount = amount;
          }
          goto LAB_0041f533;
        }
      }
      *(int *)((long)&this_00[1].super_AActor.super_DThinker.super_DObject.ObjNext + 4) =
           amount * *(int *)((long)&this_00[1].super_AActor.super_DThinker.super_DObject.ObjNext + 4
                            );
      goto LAB_0041f533;
    }
  }
  *(int *)&this_00[1].super_AActor.super_DThinker.super_DObject.ObjNext =
       amount * *(int *)&this_00[1].super_AActor.super_DThinker.super_DObject.ObjNext;
LAB_0041f533:
  bVar2 = AInventory::CallTryPickup(this_00,this,(AActor **)0x0);
  if (!bVar2) {
    (*(this_00->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(this_00);
  }
  if ((!givecheat) && ((local_50 != (AWeapon *)0x0 && !bVar5) && this->player != (player_t *)0x0)) {
    this->player->PendingWeapon = local_50;
  }
  return bVar2;
}

Assistant:

bool AActor::GiveInventory(PClassInventory *type, int amount, bool givecheat)
{
	bool result = true;

	AWeapon *savedPendingWeap = player != NULL ? player->PendingWeapon : NULL;
	bool hadweap = player != NULL ? player->ReadyWeapon != NULL : true;

	AInventory *item;
	if (!givecheat)
	{
		item = static_cast<AInventory *>(Spawn (type));
	}
	else
	{
		item = static_cast<AInventory *>(Spawn (type, Pos(), NO_REPLACE));
		if (item == NULL) return false;
	}

	// This shouldn't count for the item statistics!
	item->ClearCounters();
	if (!givecheat || amount > 0)
	{
		if (type->IsDescendantOf (RUNTIME_CLASS(ABasicArmorPickup)))
		{
			static_cast<ABasicArmorPickup*>(item)->SaveAmount *= amount;
		}
		else if (type->IsDescendantOf (RUNTIME_CLASS(ABasicArmorBonus)))
		{
			static_cast<ABasicArmorBonus*>(item)->SaveAmount *= amount;
		}
		else
		{
			if (!givecheat)
				item->Amount = amount;
			else
				item->Amount = MIN (amount, item->MaxAmount);
		}
	}
	if (!item->CallTryPickup (this))
	{
		item->Destroy ();
		result = false;
	}
	// If the item was a weapon, don't bring it up automatically
	// unless the player was not already using a weapon.
	// Don't bring it up automatically if this is called by the give cheat.
	if (!givecheat && player != NULL && savedPendingWeap != NULL && hadweap)
	{
		player->PendingWeapon = savedPendingWeap;
	}
	return result;
}